

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O0

void __thiscall
ot::commissioner::ProxyClient::SendRequest
          (ProxyClient *this,Request *aRequest,ResponseHandler *aHandler,uint16_t aPeerAloc16,
          uint16_t aPeerPort)

{
  ResponseHandler *aRequest_00;
  bool bVar1;
  Address local_148;
  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> local_130;
  anon_class_184_5_0baa9367 local_100;
  ErrorHandler local_48;
  uint16_t local_24;
  uint16_t local_22;
  uint16_t aPeerPort_local;
  ResponseHandler *pRStack_20;
  uint16_t aPeerAloc16_local;
  ResponseHandler *aHandler_local;
  Request *aRequest_local;
  ProxyClient *this_local;
  
  local_24 = aPeerPort;
  local_22 = aPeerAloc16;
  pRStack_20 = aHandler;
  aHandler_local = (ResponseHandler *)aRequest;
  aRequest_local = (Request *)this;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->mMeshLocalPrefix)
  ;
  aRequest_00 = aHandler_local;
  if (bVar1) {
    local_100.this = this;
    coap::Message::Message(&local_100.aRequest,(Message *)aHandler_local);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
              (&local_100.aHandler,aHandler);
    local_100.aPeerAloc16 = local_22;
    local_100.aPeerPort = local_24;
    std::function<void(ot::commissioner::Error)>::
    function<ot::commissioner::ProxyClient::SendRequest(ot::commissioner::coap::Message_const&,std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>,unsigned_short,unsigned_short)::__0,void>
              ((function<void(ot::commissioner::Error)> *)&local_48,&local_100);
    FetchMeshLocalPrefix(this,&local_48);
    std::function<void_(ot::commissioner::Error)>::~function(&local_48);
    SendRequest(ot::commissioner::coap::Message_const&,std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>,unsigned_short,unsigned_short)
    ::$_0::~__0((__0 *)&local_100);
  }
  else {
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
              (&local_130,aHandler);
    GetAnycastLocator(&local_148,this,local_22);
    SendRequest(this,(Request *)aRequest_00,&local_130,&local_148,local_24);
    Address::~Address(&local_148);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
    ~function(&local_130);
  }
  return;
}

Assistant:

void ProxyClient::SendRequest(const coap::Request  &aRequest,
                              coap::ResponseHandler aHandler,
                              uint16_t              aPeerAloc16,
                              uint16_t              aPeerPort)
{
    if (mMeshLocalPrefix.empty())
    {
        FetchMeshLocalPrefix([=](Error aError) {
            if (aError == ErrorCode::kNone)
            {
                SendRequest(aRequest, aHandler, GetAnycastLocator(aPeerAloc16), aPeerPort);
            }
            else
            {
                aHandler(nullptr, aError);
            }
        });
    }
    else
    {
        SendRequest(aRequest, aHandler, GetAnycastLocator(aPeerAloc16), aPeerPort);
    }
}